

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void AssignRegisters(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  OpCode OVar1;
  Utf8SourceInfo *pUVar2;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  code *pcVar4;
  bool bVar5;
  RegSlot RVar6;
  uint uVar7;
  LocalFunctionId LVar8;
  FuncInfo *pFVar9;
  FuncInfo *pFVar10;
  ParseNodeCase *pPVar11;
  ParseNodeFor *pPVar12;
  ParseNodeBlock *pPVar13;
  Type *ppFVar14;
  ParseNodeForInOrForOf *pPVar15;
  ParseNodeVar *pPVar16;
  ParseNodeVar *pPVar17;
  Symbol *pSVar18;
  ParseNodeStrTemplate *pPVar19;
  undefined4 *puVar20;
  ParseNodeTri *pPVar21;
  ParseNodeInt *pPVar22;
  ParseNodeExportDefault *pPVar23;
  ParseNodeParamPattern *pPVar24;
  ParseNodeStr *pPVar25;
  ParseNodeFloat *pPVar26;
  ParseNodeName *pPVar27;
  ParseNodeFnc *pPVar28;
  ParseNodeBin *pPVar29;
  ParseNodeCall *pPVar30;
  FunctionBody *pFVar31;
  ParseNodeFor *pPVar32;
  Type pFVar33;
  uint uVar34;
  char16_t *reason;
  ParseNodePtr this;
  undefined1 local_40 [8];
  CharacterBuffer<char16_t> symName;
  
  if (pnode == (ParseNode *)0x0) {
    return;
  }
  switch(pnode->nop) {
  case knopName:
    pPVar27 = ParseNode::AsParseNodeName(pnode);
    pSVar18 = pPVar27->sym;
    if (pSVar18 == (Symbol *)0x0) {
      pPVar27 = ParseNode::AsParseNodeName(pnode);
      if (pPVar27->pid->m_propertyId == -1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar20 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x13fd,
                           "(pnode->AsParseNodeName()->pid->GetPropertyId() != Js::Constants::NoProperty)"
                           ,
                           "pnode->AsParseNodeName()->pid->GetPropertyId() != Js::Constants::NoProperty"
                          );
        if (!bVar5) goto LAB_00834222;
        *puVar20 = 0;
      }
      bVar5 = ByteCodeGenerator::IsThis(pnode);
      if (((bVar5) &&
          (ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                                (&byteCodeGenerator->funcInfoStack->
                                  super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>),
          (*ppFVar14)->thisSymbol == (Symbol *)0x0)) && ((byteCodeGenerator->flags & 0x400) == 0)) {
        ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
        ByteCodeGenerator::AssignThisConstRegister(byteCodeGenerator);
      }
    }
    else if (((pSVar18->field_0x42 & 8) == 0) && (pSVar18->symbolType != STMemberName)) {
      pSVar3 = byteCodeGenerator->funcInfoStack;
      if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
          (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar3) {
        pFVar33 = (Type)0x0;
      }
      else {
        ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&pSVar3->
                               super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
        pFVar33 = *ppFVar14;
      }
      pFVar9 = Scope::GetEnclosingFunc(pSVar18->scope);
      if (pFVar33 == pFVar9) {
        pSVar3 = byteCodeGenerator->funcInfoStack;
        if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
            (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
            super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar3) {
          pFVar33 = (FuncInfo *)0x0;
        }
        else {
          ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (&pSVar3->
                                 super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
          pFVar33 = *ppFVar14;
        }
        bVar5 = Symbol::IsInSlot(pSVar18,byteCodeGenerator,pFVar33,false);
        if ((!bVar5) && ((pSVar18->field_0x43 & 0x10) == 0)) {
          ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (&byteCodeGenerator->funcInfoStack->
                                 super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
          uVar7 = Js::FunctionProxy::GetSourceContextId
                            (&(*ppFVar14)->byteCodeFunction->super_FunctionProxy);
          ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (&byteCodeGenerator->funcInfoStack->
                                 super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
          LVar8 = Js::FunctionProxy::GetLocalFunctionId
                            (&(*ppFVar14)->byteCodeFunction->super_FunctionProxy);
          bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,DelayCapturePhase,uVar7,LVar8);
          if (bVar5) {
            pSVar3 = byteCodeGenerator->funcInfoStack;
            if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
                (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
                super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar3) {
              pFVar33 = (FuncInfo *)0x0;
            }
            else {
              ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                                   (&pSVar3->
                                     super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>)
              ;
              pFVar33 = *ppFVar14;
            }
            bVar5 = Symbol::NeedsSlotAlloc(pSVar18,byteCodeGenerator,pFVar33);
            if (bVar5) {
              Output::Print(L"--- DelayCapture: Delayed capturing symbol \'%s\'.\n",
                            (pSVar18->name).string.ptr);
              Output::Flush();
            }
          }
          ByteCodeGenerator::AssignRegister(byteCodeGenerator,pSVar18);
          bVar5 = ByteCodeGenerator::HasInterleavingDynamicScope(byteCodeGenerator,pSVar18);
          if (!bVar5) {
            pnode->location = pSVar18->location;
          }
        }
      }
    }
    if ((pnode->field_0x1 & 6) != 2) {
      return;
    }
    goto LAB_00833bf1;
  case knopInt:
    pPVar22 = ParseNode::AsParseNodeInt(pnode);
    RVar6 = ByteCodeGenerator::EnregisterConstant(byteCodeGenerator,pPVar22->lw);
    break;
  case knopBigInt:
    RVar6 = ByteCodeGenerator::EnregisterBigIntConstant(byteCodeGenerator,pnode);
    break;
  default:
    uVar7 = ParseNode::Grfnop((uint)pnode->nop);
    if ((uVar7 & 4) != 0) goto switchD_008333bc_caseD_6d;
    if ((uVar7 & 8) == 0) {
      return;
    }
    pPVar29 = ParseNode::AsParseNodeBin(pnode);
    CheckMaybeEscapedUse(pPVar29->pnode1,byteCodeGenerator,false);
  case knopMember:
  case knopMemberShort:
  case knopSetMember:
  case knopGetMember:
switchD_008333bc_caseD_4c:
    pPVar30 = (ParseNodeCall *)ParseNode::AsParseNodeBin(pnode);
LAB_00833bed:
    pnode = pPVar30->pnodeArgs;
    goto LAB_00833bf1;
  case knopFlt:
    pPVar26 = ParseNode::AsParseNodeFloat(pnode);
    RVar6 = ByteCodeGenerator::EnregisterDoubleConstant(byteCodeGenerator,pPVar26->dbl);
    break;
  case knopStr:
    pPVar25 = ParseNode::AsParseNodeStr(pnode);
    RVar6 = ByteCodeGenerator::EnregisterStringConstant(byteCodeGenerator,pPVar25->pid);
    break;
  case knopNull:
    RVar6 = ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
    break;
  case knopFalse:
    RVar6 = ByteCodeGenerator::AssignFalseConstRegister(byteCodeGenerator);
    break;
  case knopTrue:
    RVar6 = ByteCodeGenerator::AssignTrueConstRegister(byteCodeGenerator);
    break;
  case knopYieldLeaf:
    ByteCodeGenerator::AssignFalseConstRegister(byteCodeGenerator);
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    AssignYieldResumeRegisters(byteCodeGenerator);
    return;
  case knopEllipsis:
    if (byteCodeGenerator->inDestructuredPattern == true) {
      RVar6 = ByteCodeGenerator::NextVarRegister(byteCodeGenerator);
      pnode->location = RVar6;
      goto switchD_008333bc_caseD_1f;
    }
  case knopThrow:
switchD_008333bc_caseD_6d:
    pPVar24 = (ParseNodeParamPattern *)ParseNode::AsParseNodeUni(pnode);
LAB_00833aae:
    pnode = (pPVar24->super_ParseNodeUni).pnode1;
LAB_00833bf1:
    CheckMaybeEscapedUse(pnode,byteCodeGenerator,false);
    return;
  case knopIncPost:
  case knopDecPost:
  case knopIncPre:
  case knopDecPre:
    uVar34 = 1;
    goto LAB_00833aa1;
  case knopObject:
  case knopCoalesce:
    ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
    return;
  case knopYield:
    goto switchD_008333bc_caseD_1d;
  case knopYieldStar:
    RVar6 = ByteCodeGenerator::NextVarRegister(byteCodeGenerator);
    pnode->location = RVar6;
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    ByteCodeGenerator::AssignTrueConstRegister(byteCodeGenerator);
switchD_008333bc_caseD_1d:
    ByteCodeGenerator::AssignFalseConstRegister(byteCodeGenerator);
    AssignYieldResumeRegisters(byteCodeGenerator);
    goto switchD_008333bc_caseD_6d;
  case knopAwait:
switchD_008333bc_caseD_1f:
    uVar34 = 0;
LAB_00833aa1:
    ByteCodeGenerator::EnregisterConstant(byteCodeGenerator,uVar34);
    goto switchD_008333bc_caseD_6d;
  case knopCall:
    pPVar30 = ParseNode::AsParseNodeCall(pnode);
    if ((pPVar30->pnodeTarget->nop != knopIndex) &&
       (pPVar30 = ParseNode::AsParseNodeCall(pnode), pPVar30->pnodeTarget->nop != knopDot)) {
      ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    }
    pSVar3 = byteCodeGenerator->funcInfoStack;
    if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
        (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar3) {
      pFVar33 = (FuncInfo *)0x0;
    }
    else {
      ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                           (&pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>)
      ;
      pFVar33 = *ppFVar14;
    }
    pPVar30 = ParseNode::AsParseNodeCall(pnode);
    if ((pPVar30->field_0x24 & 4) == 0) {
      return;
    }
    pFVar31 = FuncInfo::GetParsedFunctionBody(pFVar33);
    if (((pFVar31->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) != 0) {
      pFVar31 = FuncInfo::GetParsedFunctionBody(pFVar33);
      uVar34 = *(uint *)&pFVar31->field_0x178;
      pPVar30 = ParseNode::AsParseNodeCall(pnode);
      pPVar30->field_0x24 = pPVar30->field_0x24 & 0xfb | (byte)(uVar34 >> 0x16) & 4;
      return;
    }
    bVar5 = FuncInfo::IsGlobalFunction(pFVar33);
    if ((!bVar5) && ((pFVar33->field_0xb4 & 2) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x1383,"(funcInfo->IsGlobalFunction() || funcInfo->GetCallsEval())",
                         "funcInfo->IsGlobalFunction() || funcInfo->GetCallsEval()");
      if (!bVar5) goto LAB_00834222;
      *puVar20 = 0;
    }
    pFVar33->field_0xb4 = pFVar33->field_0xb4 | 2;
    pFVar31 = FuncInfo::GetParsedFunctionBody(pFVar33);
    pFVar31->field_0x17b = pFVar31->field_0x17b | 1;
    return;
  case knopDot:
    pPVar24 = (ParseNodeParamPattern *)ParseNode::AsParseNodeBin(pnode);
    goto LAB_00833aae;
  case knopAsg:
    pPVar29 = ParseNode::AsParseNodeBin(pnode);
    if (pPVar29->pnode1->nop == knopName) {
      pPVar29 = ParseNode::AsParseNodeBin(pnode);
      pPVar27 = ParseNode::AsParseNodeName(pPVar29->pnode1);
      pSVar18 = pPVar27->sym;
    }
    else {
      pSVar18 = (Symbol *)0x0;
    }
    pPVar29 = ParseNode::AsParseNodeBin(pnode);
    CheckFuncAssignment(pSVar18,pPVar29->pnode2,byteCodeGenerator);
    if ((pnode->field_0x1 & 2) != 0) {
      pPVar29 = ParseNode::AsParseNodeBin(pnode);
      CheckMaybeEscapedUse(pPVar29->pnode1,byteCodeGenerator,false);
    }
    pPVar29 = ParseNode::AsParseNodeBin(pnode);
    if ((pPVar29->pnode1->nop != knopArrayPattern) &&
       (pPVar29 = ParseNode::AsParseNodeBin(pnode), pPVar29->pnode1->nop != knopObjectPattern)) {
      return;
    }
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    ByteCodeGenerator::EnregisterConstant(byteCodeGenerator,0);
    return;
  case knopComma:
    if ((pnode->field_0x1 & 4) != 0) {
      return;
    }
    goto switchD_008333bc_caseD_4c;
  case knopNew:
    pPVar30 = ParseNode::AsParseNodeCall(pnode);
    CheckMaybeEscapedUse(pPVar30->pnodeTarget,byteCodeGenerator,false);
    pPVar30 = ParseNode::AsParseNodeCall(pnode);
    goto LAB_00833bed;
  case knopQmark:
    pPVar21 = ParseNode::AsParseNodeTri(pnode);
    CheckMaybeEscapedUse(pPVar21->pnode1,byteCodeGenerator,false);
    pPVar21 = ParseNode::AsParseNodeTri(pnode);
    CheckMaybeEscapedUse(pPVar21->pnode2,byteCodeGenerator,false);
    pPVar15 = (ParseNodeForInOrForOf *)ParseNode::AsParseNodeTri(pnode);
    goto LAB_00833b35;
  case knopVarDecl:
  case knopConstDecl:
  case knopLetDecl:
    pPVar17 = ParseNode::AsParseNodeVar(pnode);
    pSVar18 = pPVar17->sym;
    if (pSVar18 == (Symbol *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x13aa,"(sym != nullptr)","sym != nullptr");
      if (!bVar5) goto LAB_00834222;
      *puVar20 = 0;
    }
    pFVar9 = Scope::GetEnclosingFunc(pSVar18->scope);
    pSVar3 = byteCodeGenerator->funcInfoStack;
    if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
        (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar3) {
      pFVar10 = (FuncInfo *)0x0;
    }
    else {
      ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                           (&pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>)
      ;
      pFVar10 = *ppFVar14;
    }
    if (pFVar9 != pFVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x13ac,
                         "(sym->GetScope()->GetEnclosingFunc() == byteCodeGenerator->TopFuncInfo())"
                         ,"sym->GetScope()->GetEnclosingFunc() == byteCodeGenerator->TopFuncInfo()")
      ;
      if (!bVar5) goto LAB_00834222;
      *puVar20 = 0;
    }
    pPVar17 = ParseNode::AsParseNodeVar(pnode);
    if ((pPVar17->isBlockScopeFncDeclVar != '\0') && ((pSVar18->field_0x42 & 2) != 0)) {
      return;
    }
    pSVar3 = byteCodeGenerator->funcInfoStack;
    if ((pSVar18->field_0x42 & 8) == 0) {
      if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
          (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar3) {
        pFVar33 = (FuncInfo *)0x0;
      }
      else {
        ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&pSVar3->
                               super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
        pFVar33 = *ppFVar14;
      }
      pPVar17 = ParseNode::AsParseNodeVar(pnode);
      CheckFuncAssignment(pSVar18,pPVar17->pnodeInit,byteCodeGenerator);
      if ((((pSVar18->field_0x42 & 0x40) != 0) &&
          (pPVar17 = ParseNode::AsParseNodeVar(pnode),
          pPVar17->sym->scope->scopeType != ScopeType_CatchParamPattern)) ||
         ((pnode->nop == knopVarDecl &&
          (((pSVar18->field_0x42 & 2) != 0 &&
           (pPVar17 = ParseNode::AsParseNodeVar(pnode), pPVar17->isBlockScopeFncDeclVar == '\0')))))
         ) {
        if (((pSVar18->field_0x42 & 0x40) == 0) && (pFVar33->bodyScope == pSVar18->scope)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar20 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x13c5,"(funcInfo->bodyScope != sym->GetScope())",
                             "funcInfo->bodyScope != sym->GetScope()");
          if (!bVar5) goto LAB_00834222;
          *puVar20 = 0;
        }
        JsUtil::CharacterBuffer<char16_t>::CharacterBuffer
                  ((CharacterBuffer<char16_t> *)local_40,&pSVar18->name);
        pSVar18 = pFVar33->bodyScope->m_symList;
        if (pSVar18 != (Symbol *)0x0) {
          do {
            bVar5 = JsUtil::CharacterBuffer<char16_t>::operator==
                              (&pSVar18->name,(CharacterBuffer<char16_t> *)local_40);
            if (bVar5) break;
            pSVar18 = pSVar18->next;
          } while (pSVar18 != (Symbol *)0x0);
        }
        if ((pSVar18 == (Symbol *)0x0) &&
           (pSVar18 = pFVar33->paramScope->m_symList, pSVar18 != (Symbol *)0x0)) {
          do {
            bVar5 = JsUtil::CharacterBuffer<char16_t>::operator==
                              (&pSVar18->name,(CharacterBuffer<char16_t> *)local_40);
            if (bVar5) break;
            pSVar18 = pSVar18->next;
          } while (pSVar18 != (Symbol *)0x0);
        }
        if ((pSVar18 == (Symbol *)0x0) || ((pSVar18->field_0x42 & 0x42) != 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar20 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x13cf,"((sym && !sym->GetIsCatch() && !sym->GetIsBlockVar()))",
                             "(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar())");
          if (!bVar5) goto LAB_00834222;
          *puVar20 = 0;
        }
      }
      if ((pSVar18->field_0x42 & 8) != 0) {
        return;
      }
      bVar5 = Symbol::IsInSlot(pSVar18,byteCodeGenerator,pFVar33,false);
      if (bVar5) {
        return;
      }
      uVar7 = Js::FunctionProxy::GetSourceContextId(&pFVar33->byteCodeFunction->super_FunctionProxy)
      ;
      LVar8 = Js::FunctionProxy::GetLocalFunctionId(&pFVar33->byteCodeFunction->super_FunctionProxy)
      ;
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,DelayCapturePhase,uVar7,LVar8);
      if (bVar5) {
        pSVar3 = byteCodeGenerator->funcInfoStack;
        if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
            (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
            super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar3) {
          pFVar33 = (FuncInfo *)0x0;
        }
        else {
          ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (&pSVar3->
                                 super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
          pFVar33 = *ppFVar14;
        }
        bVar5 = Symbol::NeedsSlotAlloc(pSVar18,byteCodeGenerator,pFVar33);
        if (bVar5) {
          Output::Print(L"--- DelayCapture: Delayed capturing symbol \'%s\' during initialization.\n"
                        ,(pSVar18->name).string.ptr);
          Output::Flush();
        }
      }
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,pSVar18);
      return;
    }
    ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    bVar5 = FuncInfo::IsGlobalFunction(*ppFVar14);
    if (bVar5) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar20 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x13e3,"(byteCodeGenerator->TopFuncInfo()->IsGlobalFunction())",
                       "byteCodeGenerator->TopFuncInfo()->IsGlobalFunction()");
    if (bVar5) {
      *puVar20 = 0;
      return;
    }
LAB_00834222:
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  case knopFncDecl:
    ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&byteCodeGenerator->funcInfoStack->
                           super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    bVar5 = FuncInfo::IsGlobalFunction(*ppFVar14);
    if (bVar5) {
      return;
    }
    pPVar28 = ParseNode::AsParseNodeFnc(pnode);
    if ((pPVar28->fncFlags & (kFunctionIsAsync|kFunctionIsGenerator)) != kFunctionNone) {
      ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                           (&byteCodeGenerator->funcInfoStack->
                             super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
      FuncInfo::SetHasMaybeEscapedNestedFunc(*ppFVar14,L"Generator");
    }
    if ((pnode->field_0x1 & 6) == 2) {
      ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                           (&byteCodeGenerator->funcInfoStack->
                             super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
      FuncInfo::SetHasMaybeEscapedNestedFunc(*ppFVar14,L"InList");
    }
    pPVar28 = ParseNode::AsParseNodeFnc(pnode);
    pPVar17 = pPVar28->pnodeName;
    if (pPVar17 == (ParseNodeVar *)0x0) {
      return;
    }
    if (((pPVar17->super_ParseNode).nop == knopVarDecl) &&
       (pPVar16 = ParseNode::AsParseNodeVar(&pPVar17->super_ParseNode),
       pPVar16->sym != (Symbol *)0x0)) {
      pPVar16 = ParseNode::AsParseNodeVar(&pPVar17->super_ParseNode);
      Symbol::SetHasFuncAssignment(pPVar16->sym,byteCodeGenerator);
      pPVar17 = ParseNode::AsParseNodeVar(&pPVar17->super_ParseNode);
      pSVar18 = Symbol::GetFuncScopeVarSym(pPVar17->sym);
      if (pSVar18 == (Symbol *)0x0) {
        return;
      }
      Symbol::SetHasFuncAssignment(pSVar18,byteCodeGenerator);
      return;
    }
    pSVar3 = byteCodeGenerator->funcInfoStack;
    if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
        (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar3) {
      pFVar33 = (FuncInfo *)0x0;
    }
    else {
      ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                           (&pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>)
      ;
      pFVar33 = *ppFVar14;
    }
    OVar1 = (pPVar17->super_ParseNode).nop;
    if (OVar1 == knopDot) {
      reason = L"PropFuncName";
    }
    else if (OVar1 == knopList) {
      reason = L"MultipleFuncName";
    }
    else if (OVar1 == knopVarDecl) {
      pPVar17 = ParseNode::AsParseNodeVar(&pPVar17->super_ParseNode);
      reason = L"WeirdFuncName";
      if (pPVar17->sym == (Symbol *)0x0) {
        reason = L"WithScopeFuncName";
      }
    }
    else {
      reason = L"WeirdFuncName";
    }
    FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar33,reason);
    return;
  case knopClassDecl:
    ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&byteCodeGenerator->funcInfoStack->
                           super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    FuncInfo::SetHasMaybeEscapedNestedFunc(*ppFVar14,L"Class");
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    return;
  case knopProg:
    if (byteCodeGenerator->parentScopeInfo != (ScopeInfo *)0x0) {
      return;
    }
    pPVar28 = ParseNode::AsParseNodeFnc(pnode);
    PostVisitFunction(pPVar28,byteCodeGenerator);
    return;
  case knopFor:
    pPVar12 = ParseNode::AsParseNodeFor(pnode);
    if ((pPVar12->pnodeBody != (ParseNodePtr)0x0) &&
       (pPVar12 = ParseNode::AsParseNodeFor(pnode), pPVar12->pnodeBody->nop == knopBlock)) {
      pPVar12 = ParseNode::AsParseNodeFor(pnode);
      pPVar13 = ParseNode::AsParseNodeBlock(pPVar12->pnodeBody);
      if (pPVar13->pnodeStmt != (ParseNodePtr)0x0) {
        pPVar12 = ParseNode::AsParseNodeFor(pnode);
        pPVar13 = ParseNode::AsParseNodeBlock(pPVar12->pnodeBody);
        if ((pPVar13->pnodeStmt->nop == knopFor) &&
           (((pUVar2 = byteCodeGenerator->m_utf8SourceInfo,
             (pUVar2->debugModeSource).ptr == (uchar *)0x0 && ((pUVar2->field_0xa8 & 0x20) == 0)) ||
            ((pUVar2->field_0xa8 & 0x40) == 0)))) {
          pSVar3 = byteCodeGenerator->funcInfoStack;
          if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
              (pSVar3->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
              super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar3) {
            pFVar33 = (FuncInfo *)0x0;
          }
          else {
            ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                                 (&pSVar3->
                                   super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
            pFVar33 = *ppFVar14;
          }
          pPVar12 = InvertLoop(pnode,byteCodeGenerator,pFVar33);
          pPVar32 = ParseNode::AsParseNodeFor(pnode);
          pPVar32->pnodeInverted = pPVar12;
          return;
        }
      }
    }
    pPVar12 = ParseNode::AsParseNodeFor(pnode);
    pPVar12->pnodeInverted = (ParseNodeFor *)0x0;
    return;
  case knopForIn:
    pPVar15 = ParseNode::AsParseNodeForInOrForOf(pnode);
    goto LAB_00833b35;
  case knopForOf:
    goto switchD_008333bc_caseD_60;
  case knopForAwaitOf:
    ByteCodeGenerator::EnregisterConstant(byteCodeGenerator,0);
switchD_008333bc_caseD_60:
    pPVar15 = ParseNode::AsParseNodeForInOrForOf(pnode);
    ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&byteCodeGenerator->funcInfoStack->
                           super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    RVar6 = FuncInfo::NextVarRegister(*ppFVar14);
    pPVar15->shouldCallReturnFunctionLocation = RVar6;
    ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&byteCodeGenerator->funcInfoStack->
                           super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    RVar6 = FuncInfo::NextVarRegister(*ppFVar14);
    pPVar15->shouldCallReturnFunctionLocationFinally = RVar6;
    pnode = pPVar15->pnodeObj;
    goto LAB_00833bf1;
  case knopStrTemplate:
    pPVar19 = ParseNode::AsParseNodeStrTemplate(pnode);
    this = pPVar19->pnodeSubstitutionExpressions;
    if (this != (ParseNodePtr)0x0) {
      if (this->nop == knopList) {
        puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        do {
          pPVar29 = ParseNode::AsParseNodeBin(this);
          if (pPVar29->pnode1 == (ParseNodePtr)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar20 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0x144b,"(pnodeExprs->AsParseNodeBin()->pnode1 != nullptr)",
                               "pnodeExprs->AsParseNodeBin()->pnode1 != nullptr");
            if (!bVar5) goto LAB_00834222;
            *puVar20 = 0;
          }
          pPVar29 = ParseNode::AsParseNodeBin(this);
          if (pPVar29->pnode2 == (ParseNodePtr)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar20 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0x144c,"(pnodeExprs->AsParseNodeBin()->pnode2 != nullptr)",
                               "pnodeExprs->AsParseNodeBin()->pnode2 != nullptr");
            if (!bVar5) goto LAB_00834222;
            *puVar20 = 0;
          }
          pPVar29 = ParseNode::AsParseNodeBin(this);
          CheckMaybeEscapedUse(pPVar29->pnode1,byteCodeGenerator,false);
          pPVar29 = ParseNode::AsParseNodeBin(this);
          this = pPVar29->pnode2;
        } while (this->nop == knopList);
      }
      CheckMaybeEscapedUse(this,byteCodeGenerator,false);
    }
    pPVar19 = ParseNode::AsParseNodeStrTemplate(pnode);
    if ((pPVar19->field_0x2a & 1) == 0) {
      return;
    }
    RVar6 = ByteCodeGenerator::EnregisterStringTemplateCallsiteConstant(byteCodeGenerator,pnode);
    break;
  case knopWith:
    RVar6 = ByteCodeGenerator::NextVarRegister(byteCodeGenerator);
    pnode->location = RVar6;
    pPVar15 = (ParseNodeForInOrForOf *)ParseNode::AsParseNodeWith(pnode);
    goto LAB_00833b35;
  case knopSwitch:
    pPVar15 = (ParseNodeForInOrForOf *)ParseNode::AsParseNodeSwitch(pnode);
    goto LAB_00833b35;
  case knopCase:
    pPVar11 = ParseNode::AsParseNodeCase(pnode);
    pnode = pPVar11->pnodeExpr;
    goto LAB_00833bf1;
  case knopReturn:
    ppFVar14 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&byteCodeGenerator->funcInfoStack->
                           super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    bVar5 = FuncInfo::IsAsyncGenerator(*ppFVar14);
    if (bVar5) {
      ByteCodeGenerator::EnregisterConstant(byteCodeGenerator,0);
    }
    pPVar15 = (ParseNodeForInOrForOf *)ParseNode::AsParseNodeReturn(pnode);
LAB_00833b35:
    pnode = pPVar15->pnodeObj;
    goto LAB_00833bf1;
  case knopObjectPattern:
  case knopArrayPattern:
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    goto switchD_008333bc_caseD_6d;
  case knopParamPattern:
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    pPVar24 = ParseNode::AsParseNodeParamPattern(pnode);
    goto LAB_00833aae;
  case knopExportDefault:
    pPVar23 = ParseNode::AsParseNodeExportDefault(pnode);
    pnode = pPVar23->pnodeExpr;
    if (pnode == (ParseNodePtr)0x0) {
      return;
    }
    goto LAB_00833bf1;
  }
  pnode->location = RVar6;
  return;
}

Assistant:

void AssignRegisters(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    if (pnode == nullptr)
    {
        return;
    }

    Symbol *sym;
    OpCode nop = pnode->nop;
    switch (nop)
    {
    default:
        {
            uint flags = ParseNode::Grfnop(nop);
            if (flags & fnopUni)
            {
                CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
            }
            else if (flags & fnopBin)
            {
                CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator);
                CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator);
            }
        break;
    }

    case knopParamPattern:
        byteCodeGenerator->AssignUndefinedConstRegister();
        CheckMaybeEscapedUse(pnode->AsParseNodeParamPattern()->pnode1, byteCodeGenerator);
        break;

    case knopObjectPattern:
    case knopArrayPattern:
        byteCodeGenerator->AssignUndefinedConstRegister();
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;

    case knopDot:
        CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator);
        break;
    case knopMember:
    case knopMemberShort:
    case knopGetMember:
    case knopSetMember:
        CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator);
        break;

    case knopAsg:
        {
            Symbol * symName = pnode->AsParseNodeBin()->pnode1->nop == knopName ? pnode->AsParseNodeBin()->pnode1->AsParseNodeName()->sym : nullptr;
            CheckFuncAssignment(symName, pnode->AsParseNodeBin()->pnode2, byteCodeGenerator);

            if (pnode->IsInList())
            {
                // Assignment in array literal
                CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator);
            }

            if ((pnode->AsParseNodeBin()->pnode1->nop == knopArrayPattern || pnode->AsParseNodeBin()->pnode1->nop == knopObjectPattern))
            {
                // Destructured arrays may have default values and need undefined.
                byteCodeGenerator->AssignUndefinedConstRegister();

                // Any rest parameter in a destructured array will need a 0 constant.
                byteCodeGenerator->EnregisterConstant(0);
            }

        break;
    }

    case knopEllipsis:
        if (byteCodeGenerator->InDestructuredPattern())
        {
            // Get a register for the rest array counter.
            pnode->location = byteCodeGenerator->NextVarRegister();

            // Any rest parameter in a destructured array will need a 0 constant.
            byteCodeGenerator->EnregisterConstant(0);
        }
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;

    case knopQmark:
        CheckMaybeEscapedUse(pnode->AsParseNodeTri()->pnode1, byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeTri()->pnode2, byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeTri()->pnode3, byteCodeGenerator);
        break;
    case knopWith:
        pnode->location = byteCodeGenerator->NextVarRegister();
        CheckMaybeEscapedUse(pnode->AsParseNodeWith()->pnodeObj, byteCodeGenerator);
        break;
    case knopComma:
        if (!pnode->IsNotEscapedUse())
        {
            // Only the last expr in comma expr escape. Mark it if it is escapable.
            CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator);
        }
        break;
    case knopFncDecl:
        if (!byteCodeGenerator->TopFuncInfo()->IsGlobalFunction())
        {
            if (pnode->AsParseNodeFnc()->IsCoroutine())
            {
                // Assume generators always escape; otherwise need to analyze if
                // the return value of calls to generator function, the generator
                // objects, escape.
                FuncInfo* funcInfo = byteCodeGenerator->TopFuncInfo();
                funcInfo->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("Generator")));
            }

            if (pnode->IsInList() && !pnode->IsNotEscapedUse())
            {
                byteCodeGenerator->TopFuncInfo()->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("InList")));
            }

            ParseNodePtr pnodeName = pnode->AsParseNodeFnc()->pnodeName;
            if (pnodeName != nullptr)
            {
                // REVIEW: does this apply now that compat mode is gone?
                // There is a weird case in compat mode where we may not have a sym assigned to a fnc decl's
                // name node if it is a named function declare inside 'with' that also assigned to something else
                // as well. Instead, We generate two knopFncDecl node one for parent function and one for the assignment.
                // Only the top one gets a sym, not the inner one.  The assignment in the 'with' will be using the inner
                // one.  Also we will detect that the assignment to a variable is an escape inside a 'with'.
                // Since we need the sym in the fnc decl's name, we just detect the escape here as "WithScopeFuncName".

                if (pnodeName->nop == knopVarDecl && pnodeName->AsParseNodeVar()->sym != nullptr)
                {
                    // Unlike in CheckFuncAssignment, we don't check for interleaving
                    // dynamic scope ('with') here, because we also generate direct assignment for
                    // function decl's names

                    pnodeName->AsParseNodeVar()->sym->SetHasFuncAssignment(byteCodeGenerator);

                    // Function declaration in block scope and non-strict mode has a
                    // corresponding var sym that we assign to as well.  Need to
                    // mark that symbol as has func assignment as well.
                    Symbol * functionScopeVarSym = pnodeName->AsParseNodeVar()->sym->GetFuncScopeVarSym();
                    if (functionScopeVarSym)
                    {
                        functionScopeVarSym->SetHasFuncAssignment(byteCodeGenerator);
                    }
                }
                else
                {
                    // The function has multiple names, or assign to o.x or o::x
                    byteCodeGenerator->TopFuncInfo()->SetHasMaybeEscapedNestedFunc(DebugOnly(
                        pnodeName->nop == knopList ? _u("MultipleFuncName") :
                        pnodeName->nop == knopDot ? _u("PropFuncName") :
                        pnodeName->nop == knopVarDecl && pnodeName->AsParseNodeVar()->sym == nullptr ? _u("WithScopeFuncName") :
                        _u("WeirdFuncName")
                    ));
                }
            }
        }

        break;
    case knopNew:
        CheckMaybeEscapedUse(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator);
        break;
    case knopThrow:
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;

    // REVIEW: Technically, switch expr or case expr doesn't really escape as strict equal
    // doesn't cause the function to escape.
    case knopSwitch:
        CheckMaybeEscapedUse(pnode->AsParseNodeSwitch()->pnodeVal, byteCodeGenerator);
        break;
    case knopCase:
        CheckMaybeEscapedUse(pnode->AsParseNodeCase()->pnodeExpr, byteCodeGenerator);
        break;

    // REVIEW: Technically, the object for GetForInEnumerator doesn't escape, except when cached,
    // which we can make work.
    case knopForIn:
        CheckMaybeEscapedUse(pnode->AsParseNodeForInOrForOf()->pnodeObj, byteCodeGenerator);
        break;

    case knopForAwaitOf:
        AssignAwaitRegisters(byteCodeGenerator);
        // Fall-through
    case knopForOf:
        {
            ParseNodeForInOrForOf* pnodeForOf = pnode->AsParseNodeForInOrForOf();
            byteCodeGenerator->AssignNullConstRegister();
            byteCodeGenerator->AssignUndefinedConstRegister();
            pnodeForOf->shouldCallReturnFunctionLocation = byteCodeGenerator->NextVarRegister();
            pnodeForOf->shouldCallReturnFunctionLocationFinally = byteCodeGenerator->NextVarRegister();
            CheckMaybeEscapedUse(pnodeForOf->pnodeObj, byteCodeGenerator);
        }
        break;

    case knopTrue:
        pnode->location = byteCodeGenerator->AssignTrueConstRegister();
        break;

    case knopFalse:
        pnode->location = byteCodeGenerator->AssignFalseConstRegister();
        break;

    case knopDecPost:
    case knopIncPost:
    case knopDecPre:
    case knopIncPre:
        byteCodeGenerator->EnregisterConstant(1);
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;
    case knopCoalesce:
    case knopObject:
        byteCodeGenerator->AssignNullConstRegister();
        break;
    case knopClassDecl:
        {
            FuncInfo * topFunc = byteCodeGenerator->TopFuncInfo();
            topFunc->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("Class")));

            // We may need undefined for the 'this', e.g. calling a class expression
            byteCodeGenerator->AssignUndefinedConstRegister();

        break;
        }
    case knopNull:
        pnode->location = byteCodeGenerator->AssignNullConstRegister();
        break;
    case knopCall:
    {
        if (pnode->AsParseNodeCall()->pnodeTarget->nop != knopIndex &&
            pnode->AsParseNodeCall()->pnodeTarget->nop != knopDot)
        {
            byteCodeGenerator->AssignUndefinedConstRegister();
        }

        FuncInfo *funcInfo = byteCodeGenerator->TopFuncInfo();

        if (pnode->AsParseNodeCall()->isEvalCall)
        {
            if (!funcInfo->GetParsedFunctionBody()->IsReparsed())
            {
                Assert(funcInfo->IsGlobalFunction() || funcInfo->GetCallsEval());
                funcInfo->SetCallsEval(true);
                funcInfo->GetParsedFunctionBody()->SetCallsEval(true);
            }
            else
            {
                // On reparsing, load the state from function Body, instead of using the state on the parse node,
                // as they might be different.
                pnode->AsParseNodeCall()->isEvalCall = funcInfo->GetParsedFunctionBody()->GetCallsEval();
            }
        }
        // Don't need to check pnode->AsParseNodeCall()->pnodeTarget even if it is a knopFncDecl,
        // e.g. (function(){})();
        // It is only used as a call, so don't count as an escape.
        // Although not assigned to a slot, we will still able to box it by boxing
        // all the stack function on the interpreter frame or the stack function link list
        // on a jitted frame
        break;
    }

    case knopInt:
        pnode->location = byteCodeGenerator->EnregisterConstant(pnode->AsParseNodeInt()->lw);
        break;
    case knopFlt:
    {
        pnode->location = byteCodeGenerator->EnregisterDoubleConstant(pnode->AsParseNodeFloat()->dbl);
        break;
    }
    case knopBigInt:
        pnode->location = byteCodeGenerator->EnregisterBigIntConstant(pnode);
        break;
    case knopStr:
        pnode->location = byteCodeGenerator->EnregisterStringConstant(pnode->AsParseNodeStr()->pid);
        break;
    case knopVarDecl:
    case knopConstDecl:
    case knopLetDecl:
        {
            sym = pnode->AsParseNodeVar()->sym;
            Assert(sym != nullptr);

            Assert(sym->GetScope()->GetEnclosingFunc() == byteCodeGenerator->TopFuncInfo());

            if (pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar())
            {
                break;
            }

            if (!sym->GetIsGlobal())
            {
                FuncInfo *funcInfo = byteCodeGenerator->TopFuncInfo();

                // Check the function assignment for the sym that we have, even if we remap it to function level sym below
                // as we are going assign to the original sym
                CheckFuncAssignment(sym, pnode->AsParseNodeVar()->pnodeInit, byteCodeGenerator);

                // If this is a destructured param case then it is a let binding and we don't have to look for duplicate symbol in the body
                if ((sym->GetIsCatch() && pnode->AsParseNodeVar()->sym->GetScope()->GetScopeType() != ScopeType_CatchParamPattern) || (pnode->nop == knopVarDecl && sym->GetIsBlockVar() && !pnode->AsParseNodeVar()->isBlockScopeFncDeclVar))
                {
                    // The LHS of the var decl really binds to the local symbol, not the catch or let symbol.
                    // But the assignment will go to the catch or let symbol. Just assign a register to the local
                    // so that it can get initialized to undefined.
#if DBG
                    if (!sym->GetIsCatch())
                    {
                        // Catch cannot be at function scope and let and var at function scope is redeclaration error.
                        Assert(funcInfo->bodyScope != sym->GetScope());
                    }
#endif
                    auto symName = sym->GetName();
                    sym = funcInfo->bodyScope->FindLocalSymbol(symName);

                    if (sym == nullptr)
                    {
                        sym = funcInfo->paramScope->FindLocalSymbol(symName);
                    }
                    Assert((sym && !sym->GetIsCatch() && !sym->GetIsBlockVar()));
                }
                // Don't give the declared var a register if it's in a closure, because the closure slot
                // is its true "home". (Need to check IsGlobal again as the sym may have changed above.)
                if (!sym->GetIsGlobal() && !sym->IsInSlot(byteCodeGenerator, funcInfo))
                {
                    if (PHASE_TRACE(Js::DelayCapturePhase, funcInfo->byteCodeFunction))
                    {
                        if (sym->NeedsSlotAlloc(byteCodeGenerator, byteCodeGenerator->TopFuncInfo()))
                        {
                            Output::Print(_u("--- DelayCapture: Delayed capturing symbol '%s' during initialization.\n"),
                                sym->GetName().GetBuffer());
                            Output::Flush();
                        }
                    }
                    byteCodeGenerator->AssignRegister(sym);
                }
            }
            else
            {
                Assert(byteCodeGenerator->TopFuncInfo()->IsGlobalFunction());
            }

            break;
        }

    case knopFor:
        if ((pnode->AsParseNodeFor()->pnodeBody != nullptr) && (pnode->AsParseNodeFor()->pnodeBody->nop == knopBlock) &&
            (pnode->AsParseNodeFor()->pnodeBody->AsParseNodeBlock()->pnodeStmt != nullptr) &&
            (pnode->AsParseNodeFor()->pnodeBody->AsParseNodeBlock()->pnodeStmt->nop == knopFor) &&
            (!byteCodeGenerator->IsInDebugMode()))
        {
                FuncInfo *funcInfo = byteCodeGenerator->TopFuncInfo();
            pnode->AsParseNodeFor()->pnodeInverted = InvertLoop(pnode, byteCodeGenerator, funcInfo);
        }
        else
        {
            pnode->AsParseNodeFor()->pnodeInverted = nullptr;
        }

        break;

    case knopName:
        sym = pnode->AsParseNodeName()->sym;
        if (sym == nullptr)
        {
            Assert(pnode->AsParseNodeName()->pid->GetPropertyId() != Js::Constants::NoProperty);

            // Referring to 'this' with no var decl needs to load 'this' root value via LdThis from null
            if (ByteCodeGenerator::IsThis(pnode) && !byteCodeGenerator->TopFuncInfo()->GetThisSymbol() && !(byteCodeGenerator->GetFlags() & fscrEval))
            {
                byteCodeGenerator->AssignNullConstRegister();
                byteCodeGenerator->AssignThisConstRegister();
            }
        }
        else
        {
            // Note: don't give a register to a local if it's in a closure, because then the closure
            // is its true home.
            if (!sym->GetIsGlobal() &&
                !sym->GetIsMember() &&
                byteCodeGenerator->TopFuncInfo() == sym->GetScope()->GetEnclosingFunc() &&
                !sym->IsInSlot(byteCodeGenerator, byteCodeGenerator->TopFuncInfo()) &&
                !sym->HasVisitedCapturingFunc())
            {
                if (PHASE_TRACE(Js::DelayCapturePhase, byteCodeGenerator->TopFuncInfo()->byteCodeFunction))
                {
                    if (sym->NeedsSlotAlloc(byteCodeGenerator, byteCodeGenerator->TopFuncInfo()))
                    {
                        Output::Print(_u("--- DelayCapture: Delayed capturing symbol '%s'.\n"),
                            sym->GetName().GetBuffer());
                        Output::Flush();
                    }
                }

                // Local symbol being accessed in its own frame. Even if "with" or event
                // handler semantics make the binding ambiguous, it has a home location,
                // so assign it.
                byteCodeGenerator->AssignRegister(sym);

                // If we're in something like a "with" we'll need a scratch register to hold
                // the multiple possible values of the property.
                if (!byteCodeGenerator->HasInterleavingDynamicScope(sym))
                {
                    // We're not in a dynamic scope, or our home scope is nested within the dynamic scope, so we
                    // don't have to do dynamic binding. Just use the home location for this reference.
                    pnode->location = sym->GetLocation();
                }
            }
        }
        if (pnode->IsInList() && !pnode->IsNotEscapedUse())
        {
            // A node that is in a list is assumed to be escape, unless marked otherwise.
            // This includes array literal list/object literal list
            CheckMaybeEscapedUse(pnode, byteCodeGenerator);
        }
        break;

    case knopProg:
        if (!byteCodeGenerator->HasParentScopeInfo())
        {
            // If we're compiling a nested deferred function, don't pop the scope stack,
            // because we just want to leave it as-is for the emit pass.
            PostVisitFunction(pnode->AsParseNodeFnc(), byteCodeGenerator);
        }
        break;
    case knopReturn:
        {
            if (byteCodeGenerator->TopFuncInfo()->IsAsyncGenerator())
            {
                AssignAwaitRegisters(byteCodeGenerator);
            }
            ParseNode *pnodeExpr = pnode->AsParseNodeReturn()->pnodeExpr;
            CheckMaybeEscapedUse(pnodeExpr, byteCodeGenerator);
            break;
        }

    case knopStrTemplate:
        {
            ParseNode* pnodeExprs = pnode->AsParseNodeStrTemplate()->pnodeSubstitutionExpressions;
            if (pnodeExprs != nullptr)
            {
                while (pnodeExprs->nop == knopList)
                {
                    Assert(pnodeExprs->AsParseNodeBin()->pnode1 != nullptr);
                    Assert(pnodeExprs->AsParseNodeBin()->pnode2 != nullptr);

                    CheckMaybeEscapedUse(pnodeExprs->AsParseNodeBin()->pnode1, byteCodeGenerator);
                    pnodeExprs = pnodeExprs->AsParseNodeBin()->pnode2;
                }

                // Also check the final element in the list
                CheckMaybeEscapedUse(pnodeExprs, byteCodeGenerator);
            }

            if (pnode->AsParseNodeStrTemplate()->isTaggedTemplate)
            {
                pnode->location = byteCodeGenerator->EnregisterStringTemplateCallsiteConstant(pnode);
            }
            break;
        }
    case knopExportDefault:
        {
            ParseNode* expr = pnode->AsParseNodeExportDefault()->pnodeExpr;

            if (expr != nullptr)
            {
                CheckMaybeEscapedUse(expr, byteCodeGenerator);
            }

            break;
        }
    case knopYieldLeaf:
        // The done property of the result object is set to false and the
        // value property is set to undefined
        byteCodeGenerator->AssignFalseConstRegister();
        byteCodeGenerator->AssignUndefinedConstRegister();
        AssignYieldResumeRegisters(byteCodeGenerator);
        break;
    case knopAwait:
        AssignAwaitRegisters(byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;
    case knopYield:
        // The done property of the result object is set to false
        byteCodeGenerator->AssignFalseConstRegister();
        AssignYieldResumeRegisters(byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;
    case knopYieldStar:
        // Reserve a local for our YieldStar loop so that the backend doesn't complain
        pnode->location = byteCodeGenerator->NextVarRegister();
        byteCodeGenerator->AssignUndefinedConstRegister();
        byteCodeGenerator->AssignTrueConstRegister();
        byteCodeGenerator->AssignFalseConstRegister();
        AssignYieldResumeRegisters(byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;
    }
}